

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int whereLoopAddVirtual(WhereLoopBuilder *pBuilder,Bitmask mPrereq,Bitmask mUnusable)

{
  byte *pbVar1;
  byte bVar2;
  ushort uVar3;
  short sVar4;
  ushort uVar5;
  SrcList *pSVar6;
  Expr *pEVar7;
  Expr *pEVar8;
  ExprList *pEVar9;
  Bitmask BVar10;
  WhereLoopBuilder *pBuilder_00;
  Parse *pPVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  char *zRight;
  Table *pIdxInfo;
  ulong uVar15;
  undefined4 uVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  anon_union_8_3_bb5b150a_for_u *paVar21;
  ulong uVar22;
  WhereTerm *pTerm;
  anon_struct_4_9_b482b7ef_for_fg *paVar23;
  ulong uVar24;
  ulong uVar25;
  u16 uVar26;
  undefined4 uVar27;
  int iVar28;
  sqlite3_index_constraint *psVar29;
  ushort uVar30;
  Bitmask mNext;
  long lVar31;
  ulong uVar32;
  bool bVar33;
  int bIn;
  undefined8 local_90;
  uint local_84;
  ulong local_80;
  ExprList *local_78;
  Bitmask local_70;
  Table *local_68;
  WhereLoopBuilder *local_60;
  uint local_54;
  int local_50;
  int bRetry;
  WhereLoop *local_48;
  Parse *local_40;
  WhereClause *local_38;
  
  bRetry = 0;
  local_90 = pBuilder->pWInfo;
  local_38 = pBuilder->pWC;
  local_40 = local_90->pParse;
  pSVar6 = local_90->pTabList;
  local_48 = pBuilder->pNew;
  bVar2 = local_48->iTab;
  local_78 = local_90->pOrderBy;
  local_68 = pSVar6->a[bVar2].pTab;
  pTerm = local_38->a;
  iVar28 = 0;
  iVar18 = local_38->nTerm;
  local_70 = mPrereq;
  local_60 = pBuilder;
  if (local_38->nTerm < 1) {
    iVar18 = iVar28;
  }
  while (bVar33 = iVar18 != 0, iVar18 = iVar18 + -1, bVar33) {
    uVar3 = pTerm->wtFlags;
    pTerm->wtFlags = uVar3 & 0xffbf;
    if ((((pTerm->leftCursor == pSVar6->a[bVar2].iCursor) && ((pTerm->prereqRight & mUnusable) == 0)
         ) && (-1 < (char)uVar3 && (pTerm->eOperator & 0xf7ff) != 0)) &&
       (((pSVar6->a[bVar2].fg.jointype & 0x58) == 0 ||
        (iVar12 = constraintCompatibleWithOuterJoin(pTerm,pSVar6->a + bVar2), iVar12 != 0)))) {
      iVar28 = iVar28 + 1;
      pTerm->wtFlags = uVar3 | 0x40;
    }
    pTerm = pTerm + 1;
  }
  if (local_78 == (ExprList *)0x0) {
    uVar19 = 0;
    local_80 = 0;
  }
  else {
    uVar19 = local_78->nExpr;
    local_80 = (ulong)uVar19;
    uVar22 = 0;
    uVar20 = 0;
    pEVar9 = local_78;
    if (0 < (int)uVar19) {
      uVar20 = (ulong)uVar19;
    }
    for (; paVar23 = &pEVar9->a[0].fg, uVar20 != uVar22; uVar22 = uVar22 + 1) {
      pEVar7 = pEVar9->a[0].pExpr;
      iVar18 = sqlite3ExprIsConstant((Parse *)0x0,pEVar7);
      if (iVar18 != 0) goto LAB_0017d043;
      if ((paVar23->sortFlags & 2) != 0) {
LAB_0017d05a:
        uVar20 = uVar22 & 0xffffffff;
        break;
      }
      if (pEVar7->op != 'q') {
        if ((pEVar7->op == 0xa7) && (pEVar7->iTable == pSVar6->a[bVar2].iCursor)) goto LAB_0017d043;
        goto LAB_0017d05a;
      }
      pEVar8 = pEVar7->pLeft;
      if ((pEVar8->op != 0xa7) || (pEVar8->iTable != pSVar6->a[bVar2].iCursor)) goto LAB_0017d05a;
      sVar4 = pEVar8->iColumn;
      pEVar7->iColumn = sVar4;
      if (-1 < (long)sVar4) {
        zRight = sqlite3ColumnColl(local_68->aCol + sVar4);
        if (zRight == (char *)0x0) {
          zRight = "BINARY";
        }
        iVar18 = sqlite3_stricmp((pEVar7->u).zToken,zRight);
        if (iVar18 != 0) goto LAB_0017d05a;
      }
LAB_0017d043:
      pEVar9 = (ExprList *)paVar23;
    }
    if ((int)uVar20 == (int)local_80) {
      uVar3 = local_90->wctrlFlags;
      if (((char)uVar3 < '\0') && ((pSVar6->a[bVar2].fg.field_0x2 & 0x40) == 0)) {
        uVar19 = uVar3 >> 9 & 1 | 2;
      }
      else {
        uVar19 = uVar3 >> 6 & 1;
      }
    }
    else {
      uVar19 = 0;
      local_80 = 0;
    }
  }
  pPVar11 = local_40;
  lVar31 = (long)iVar28;
  iVar18 = (int)local_80;
  pIdxInfo = (Table *)sqlite3DbMallocZero(local_40->db,(long)iVar18 * 8 + lVar31 * 0x1c + 0x88);
  if (pIdxInfo == (Table *)0x0) {
    sqlite3ErrorMsg(pPVar11,"out of memory");
  }
  else {
    psVar29 = (sqlite3_index_constraint *)
              (&((sqlite3_index_info *)((long)pIdxInfo + 0x60))->aConstraintUsage + lVar31);
    local_90 = (WhereInfo *)
               ((long)&((sqlite3_index_info *)((long)pIdxInfo + 0x60))->aConstraintUsage +
               lVar31 * 0x14);
    ((sqlite3_index_info *)pIdxInfo)->aConstraint = psVar29;
    ((sqlite3_index_info *)pIdxInfo)->aOrderBy = (sqlite3_index_orderby *)local_90;
    ((sqlite3_index_info *)pIdxInfo)->aConstraintUsage =
         (sqlite3_index_constraint_usage *)((long)local_90 + (long)iVar18 * 8);
    *(WhereClause **)((long)pIdxInfo + 0x60) = local_38;
    ((sqlite3_index_info *)((long)pIdxInfo + 0x60))->aConstraint =
         (sqlite3_index_constraint *)pPVar11;
    ((sqlite3_index_info *)((long)pIdxInfo + 0x60))->nOrderBy = uVar19;
    *(undefined4 *)&((sqlite3_index_info *)((long)pIdxInfo + 0x60))->field_0x14 = 0;
    iVar18 = local_38->nTerm;
    if (local_38->nTerm < 1) {
      iVar18 = 0;
    }
    paVar21 = &local_38->a->u;
    uVar19 = 0;
    local_84 = 0;
    iVar28 = 0;
    local_68 = pIdxInfo;
    for (iVar12 = 0; pEVar9 = local_78, iVar18 != iVar12; iVar12 = iVar12 + 1) {
      uVar3 = *(u16 *)((long)paVar21 + -0xe);
      if ((uVar3 & 0x40) != 0) {
        psVar29[iVar28].iColumn = (paVar21->x).leftColumn;
        psVar29[iVar28].iTermOffset = iVar12;
        uVar5 = *(u16 *)((long)paVar21 + -0xc);
        uVar30 = uVar5 & 0x3fff;
        if (uVar30 == 1) {
          if (-1 < (short)uVar3) {
            uVar13 = 1 << ((byte)iVar28 & 0x1f);
            if (0x1f < iVar28) {
              uVar13 = 0;
            }
            uVar19 = uVar19 | uVar13;
            *(uint *)&((sqlite3_index_info *)((long)local_68 + 0x60))->field_0x14 = uVar19;
          }
          psVar29[iVar28].op = '\x02';
        }
        else if (uVar30 == 0x40) {
          psVar29[iVar28].op = *(u8 *)((long)paVar21 + -9);
        }
        else if ((uVar5 & 0x180) == 0) {
          psVar29[iVar28].op = (uchar)uVar5;
          if (((uVar5 & 0x3c) != 0) &&
             (local_54 = uVar19, local_50 = iVar18,
             iVar14 = sqlite3ExprIsVector(((WhereTerm *)(paVar21 + -4))->pExpr->pRight),
             uVar19 = local_54, iVar18 = local_50, iVar14 != 0)) {
            uVar13 = 1 << ((byte)iVar28 & 0x1f);
            if (0xf < iVar28) {
              uVar13 = 0;
            }
            local_84 = local_84 | uVar13;
            if (uVar30 == 4) {
              psVar29[iVar28].op = ' ';
            }
            else if (uVar30 == 0x10) {
              psVar29[iVar28].op = '\b';
            }
          }
        }
        else if (uVar30 == 0x100) {
          psVar29[iVar28].op = 'G';
        }
        else {
          psVar29[iVar28].op = 'H';
        }
        iVar28 = iVar28 + 1;
        pIdxInfo = local_68;
      }
      paVar21 = paVar21 + 7;
    }
    ((sqlite3_index_info *)pIdxInfo)->nConstraint = iVar28;
    uVar22 = 0;
    uVar20 = local_80 & 0xffffffff;
    if ((int)local_80 < 1) {
      uVar20 = uVar22;
    }
    iVar18 = 0;
    for (; pPVar11 = local_40, uVar20 * 0x18 - uVar22 != 0; uVar22 = uVar22 + 0x18) {
      pEVar7 = *(Expr **)((long)&pEVar9->a[0].pExpr + uVar22);
      iVar28 = sqlite3ExprIsConstant((Parse *)0x0,pEVar7);
      if (iVar28 == 0) {
        ((sqlite3_index_orderby *)((long)local_90 + (long)iVar18 * 8))->iColumn =
             (int)pEVar7->iColumn;
        ((sqlite3_index_orderby *)((long)local_90 + (long)iVar18 * 8))->desc =
             (&pEVar9->a[0].fg.sortFlags)[uVar22] & 1;
        iVar18 = iVar18 + 1;
      }
    }
    ((sqlite3_index_info *)pIdxInfo)->nOrderBy = iVar18;
    local_48->rSetup = 0;
    local_48->wsFlags = 0x400;
    local_48->nLTerm = 0;
    pbVar1 = (byte *)((long)&local_48->u + 4);
    *pbVar1 = *pbVar1 & 0xfe;
    uVar19 = ((sqlite3_index_info *)pIdxInfo)->nConstraint;
    iVar18 = whereLoopResize(local_40->db,local_48,uVar19);
    pBuilder_00 = local_60;
    BVar10 = local_70;
    uVar13 = local_84;
    if (iVar18 == 0) {
      uVar26 = (u16)local_84;
      iVar18 = whereLoopAddVirtualOne
                         (local_60,local_70,0xffffffffffffffff,0,(sqlite3_index_info *)pIdxInfo,
                          (u16)local_84,&bIn,&bRetry);
      local_90 = (WhereInfo *)(CONCAT44(local_90._4_4_,uVar13) & 0xffffffff0000ffff);
      if (bRetry != 0) {
        iVar18 = whereLoopAddVirtualOne
                           (pBuilder_00,BVar10,0xffffffffffffffff,0,(sqlite3_index_info *)pIdxInfo,
                            uVar26,&bIn,(int *)0x0);
      }
      if (iVar18 == 0) {
        uVar20 = ~local_70;
        uVar22 = local_48->prereq & uVar20;
        iVar18 = 0;
        if (bIn != 0 || uVar22 != 0) {
          if (bIn == 0) {
            iVar18 = 0;
            uVar13 = 0;
            local_80 = 0;
          }
          else {
            iVar18 = whereLoopAddVirtualOne
                               (local_60,local_70,0xffffffffffffffff,1,
                                (sqlite3_index_info *)pIdxInfo,(u16)local_90,&bIn,(int *)0x0);
            local_80 = local_48->prereq & uVar20;
            uVar13 = (uint)(local_80 == 0);
          }
          uVar24 = (ulong)uVar19;
          if ((int)uVar19 < 1) {
            uVar24 = 0;
          }
          local_78 = (ExprList *)CONCAT44(local_78._4_4_,uVar13);
          local_84 = (uint)(uVar13 == 0);
          uVar15 = 0;
          uVar27 = (undefined4)local_90;
          while( true ) {
            BVar10 = local_70;
            if (iVar18 != 0) break;
            uVar32 = 0xffffffffffffffff;
            for (lVar31 = 0; uVar24 * 0xc - lVar31 != 0; lVar31 = lVar31 + 0xc) {
              uVar17 = local_38->a
                       [*(int *)((long)&((sqlite3_index_info *)pIdxInfo)->aConstraint->iTermOffset +
                                lVar31)].prereqRight & uVar20;
              uVar25 = uVar32;
              if (uVar17 < uVar32) {
                uVar25 = uVar17;
              }
              if (uVar15 < uVar17) {
                uVar32 = uVar25;
              }
            }
            iVar18 = 0;
            if (uVar32 == 0xffffffffffffffff) {
              if ((local_84 & 1) == 0) {
                iVar28 = (int)local_78;
                uVar26 = (u16)uVar27;
              }
              else {
                iVar18 = whereLoopAddVirtualOne
                                   (local_60,local_70,local_70,0,(sqlite3_index_info *)pIdxInfo,
                                    (u16)local_90,&bIn,(int *)0x0);
                iVar28 = (int)local_78;
                uVar26 = (u16)local_90;
                if (bIn == 0) {
                  iVar28 = 1;
                }
              }
              if (iVar28 == 0 && iVar18 == 0) {
                iVar18 = whereLoopAddVirtualOne
                                   (local_60,local_70,local_70,1,(sqlite3_index_info *)pIdxInfo,
                                    uVar26,&bIn,(int *)0x0);
              }
              break;
            }
            uVar15 = uVar32;
            if ((uVar32 != uVar22) && (uVar32 != local_80)) {
              iVar18 = whereLoopAddVirtualOne
                                 (local_60,local_70,uVar32 | local_70,0,
                                  (sqlite3_index_info *)local_68,(u16)local_90,&bIn,(int *)0x0);
              pIdxInfo = local_68;
              uVar27 = (undefined4)local_90;
              if (local_48->prereq == BVar10) {
                uVar16 = (int)local_78;
                if (bIn == 0) {
                  uVar16 = 1;
                }
                local_78 = (ExprList *)CONCAT44(local_78._4_4_,uVar16);
                local_84 = 0;
              }
            }
          }
        }
      }
      if (((sqlite3_index_info *)pIdxInfo)->needToFreeIdxStr != 0) {
        sqlite3_free(((sqlite3_index_info *)pIdxInfo)->idxStr);
      }
      freeIndexInfo(local_40->db,(sqlite3_index_info *)pIdxInfo);
      return iVar18;
    }
    freeIndexInfo(pPVar11->db,(sqlite3_index_info *)pIdxInfo);
  }
  return 7;
}

Assistant:

static int whereLoopAddVirtual(
  WhereLoopBuilder *pBuilder,  /* WHERE clause information */
  Bitmask mPrereq,             /* Tables that must be scanned before this one */
  Bitmask mUnusable            /* Tables that must be scanned after this one */
){
  int rc = SQLITE_OK;          /* Return code */
  WhereInfo *pWInfo;           /* WHERE analysis context */
  Parse *pParse;               /* The parsing context */
  WhereClause *pWC;            /* The WHERE clause */
  SrcItem *pSrc;               /* The FROM clause term to search */
  sqlite3_index_info *p;       /* Object to pass to xBestIndex() */
  int nConstraint;             /* Number of constraints in p */
  int bIn;                     /* True if plan uses IN(...) operator */
  WhereLoop *pNew;
  Bitmask mBest;               /* Tables used by best possible plan */
  u16 mNoOmit;
  int bRetry = 0;              /* True to retry with LIMIT/OFFSET disabled */

  assert( (mPrereq & mUnusable)==0 );
  pWInfo = pBuilder->pWInfo;
  pParse = pWInfo->pParse;
  pWC = pBuilder->pWC;
  pNew = pBuilder->pNew;
  pSrc = &pWInfo->pTabList->a[pNew->iTab];
  assert( IsVirtual(pSrc->pTab) );
  p = allocateIndexInfo(pWInfo, pWC, mUnusable, pSrc, &mNoOmit);
  if( p==0 ) return SQLITE_NOMEM_BKPT;
  pNew->rSetup = 0;
  pNew->wsFlags = WHERE_VIRTUALTABLE;
  pNew->nLTerm = 0;
  pNew->u.vtab.needFree = 0;
  nConstraint = p->nConstraint;
  if( whereLoopResize(pParse->db, pNew, nConstraint) ){
    freeIndexInfo(pParse->db, p);
    return SQLITE_NOMEM_BKPT;
  }

  /* First call xBestIndex() with all constraints usable. */
  WHERETRACE(0x800, ("BEGIN %s.addVirtual()\n", pSrc->pTab->zName));
  WHERETRACE(0x800, ("  VirtualOne: all usable\n"));
  rc = whereLoopAddVirtualOne(
      pBuilder, mPrereq, ALLBITS, 0, p, mNoOmit, &bIn, &bRetry
  );
  if( bRetry ){
    assert( rc==SQLITE_OK );
    rc = whereLoopAddVirtualOne(
        pBuilder, mPrereq, ALLBITS, 0, p, mNoOmit, &bIn, 0
    );
  }

  /* If the call to xBestIndex() with all terms enabled produced a plan
  ** that does not require any source tables (IOW: a plan with mBest==0)
  ** and does not use an IN(...) operator, then there is no point in making
  ** any further calls to xBestIndex() since they will all return the same
  ** result (if the xBestIndex() implementation is sane). */
  if( rc==SQLITE_OK && ((mBest = (pNew->prereq & ~mPrereq))!=0 || bIn) ){
    int seenZero = 0;             /* True if a plan with no prereqs seen */
    int seenZeroNoIN = 0;         /* Plan with no prereqs and no IN(...) seen */
    Bitmask mPrev = 0;
    Bitmask mBestNoIn = 0;

    /* If the plan produced by the earlier call uses an IN(...) term, call
    ** xBestIndex again, this time with IN(...) terms disabled. */
    if( bIn ){
      WHERETRACE(0x800, ("  VirtualOne: all usable w/o IN\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, ALLBITS, WO_IN, p, mNoOmit, &bIn, 0);
      assert( bIn==0 );
      mBestNoIn = pNew->prereq & ~mPrereq;
      if( mBestNoIn==0 ){
        seenZero = 1;
        seenZeroNoIN = 1;
      }
    }

    /* Call xBestIndex once for each distinct value of (prereqRight & ~mPrereq)
    ** in the set of terms that apply to the current virtual table.  */
    while( rc==SQLITE_OK ){
      int i;
      Bitmask mNext = ALLBITS;
      assert( mNext>0 );
      for(i=0; i<nConstraint; i++){
        Bitmask mThis = (
            pWC->a[p->aConstraint[i].iTermOffset].prereqRight & ~mPrereq
        );
        if( mThis>mPrev && mThis<mNext ) mNext = mThis;
      }
      mPrev = mNext;
      if( mNext==ALLBITS ) break;
      if( mNext==mBest || mNext==mBestNoIn ) continue;
      WHERETRACE(0x800, ("  VirtualOne: mPrev=%04llx mNext=%04llx\n",
                       (sqlite3_uint64)mPrev, (sqlite3_uint64)mNext));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mNext|mPrereq, 0, p, mNoOmit, &bIn, 0);
      if( pNew->prereq==mPrereq ){
        seenZero = 1;
        if( bIn==0 ) seenZeroNoIN = 1;
      }
    }

    /* If the calls to xBestIndex() in the above loop did not find a plan
    ** that requires no source tables at all (i.e. one guaranteed to be
    ** usable), make a call here with all source tables disabled */
    if( rc==SQLITE_OK && seenZero==0 ){
      WHERETRACE(0x800, ("  VirtualOne: all disabled\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mPrereq, 0, p, mNoOmit, &bIn, 0);
      if( bIn==0 ) seenZeroNoIN = 1;
    }

    /* If the calls to xBestIndex() have so far failed to find a plan
    ** that requires no source tables at all and does not use an IN(...)
    ** operator, make a final call to obtain one here.  */
    if( rc==SQLITE_OK && seenZeroNoIN==0 ){
      WHERETRACE(0x800, ("  VirtualOne: all disabled and w/o IN\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mPrereq, WO_IN, p, mNoOmit, &bIn, 0);
    }
  }

  if( p->needToFreeIdxStr ) sqlite3_free(p->idxStr);
  freeIndexInfo(pParse->db, p);
  WHERETRACE(0x800, ("END %s.addVirtual(), rc=%d\n", pSrc->pTab->zName, rc));
  return rc;
}